

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::cleanUp(void)

{
  undefined **ppuVar1;
  undefined8 *puVar2;
  
  if ((anonymous_namespace)::getTheRegistryHub()::theRegistryHub == (undefined8 *)0x0) {
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub = (undefined8 *)operator_new(0xd8);
    ppuVar1 = &PTR__RegistryHub_00165318;
    *(anonymous_namespace)::getTheRegistryHub()::theRegistryHub = &PTR__RegistryHub_00165318;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[1] = &PTR__RegistryHub_00165368;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[2] = &PTR__TestRegistry_001646a0;
    *(undefined4 *)((anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 4) = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[5] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[6] =
         (anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 4;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[7] =
         (anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 4;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[8] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[9] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[10] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xb] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xc] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xd] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xe] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xf] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x10] =
         &PTR__ReporterRegistry_001654d8;
    *(undefined4 *)((anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 0x12) = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x13] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x14] =
         (anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 0x12;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x15] =
         (anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 0x12;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x16] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x17] =
         &PTR__ExceptionTranslatorRegistry_00165520;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x1a] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x18] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x19] = 0;
  }
  else {
    ppuVar1 = (undefined **)*(anonymous_namespace)::getTheRegistryHub()::theRegistryHub;
  }
  (*(code *)ppuVar1[1])();
  if ((anonymous_namespace)::getTheRegistryHub()::theRegistryHub == (undefined8 *)0x0) {
    puVar2 = (undefined8 *)operator_new(0xd8);
    *puVar2 = &PTR__RegistryHub_00165318;
    puVar2[1] = &PTR__RegistryHub_00165368;
    puVar2[2] = &PTR__TestRegistry_001646a0;
    *(undefined4 *)(puVar2 + 4) = 0;
    puVar2[5] = 0;
    puVar2[6] = puVar2 + 4;
    puVar2[7] = puVar2 + 4;
    puVar2[8] = 0;
    puVar2[9] = 0;
    puVar2[10] = 0;
    puVar2[0xb] = 0;
    puVar2[0xc] = 0;
    puVar2[0xd] = 0;
    puVar2[0xe] = 0;
    puVar2[0xf] = 0;
    puVar2[0x10] = &PTR__ReporterRegistry_001654d8;
    *(undefined4 *)(puVar2 + 0x12) = 0;
    puVar2[0x13] = 0;
    puVar2[0x14] = puVar2 + 0x12;
    puVar2[0x15] = puVar2 + 0x12;
    puVar2[0x16] = 0;
    puVar2[0x17] = &PTR__ExceptionTranslatorRegistry_00165520;
    puVar2[0x1a] = 0;
    puVar2[0x18] = 0;
    puVar2[0x19] = 0;
  }
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub = (undefined8 *)0x0;
  if ((anonymous_namespace)::currentContext != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::currentContext + 8))();
  }
  (anonymous_namespace)::currentContext = (long *)0x0;
  return;
}

Assistant:

void cleanUp() {
        delete getTheRegistryHub();
        getTheRegistryHub() = NULL;
        cleanUpContext();
    }